

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,wchar_t *s,size_t size,AlignSpec *spec)

{
  long lVar1;
  wchar_t wVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t size_1;
  CharPtr __dest;
  int iVar19;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar11 = (ulong)(spec->super_WidthSpec).width_;
  puVar3 = *(undefined8 **)(this + 8);
  lVar4 = puVar3[2];
  if (size < uVar11) {
    uVar11 = uVar11 + lVar4;
    puVar10 = puVar3;
    if ((ulong)puVar3[3] < uVar11) {
      (**(code **)*puVar3)(puVar3,uVar11);
      puVar10 = *(undefined8 **)(this + 8);
    }
    puVar3[2] = uVar11;
    auVar8 = _DAT_001acfc0;
    auVar7 = _DAT_001a9230;
    auVar6 = _DAT_001a9220;
    lVar5 = puVar10[1];
    __dest = (CharPtr)(lVar5 + lVar4 * 4);
    uVar11 = (ulong)(spec->super_WidthSpec).width_;
    wVar2 = (spec->super_WidthSpec).fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar9 = uVar11 - size >> 1;
      if (1 < uVar11 - size) {
        uVar12 = uVar9 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar12;
        auVar24._0_8_ = uVar12;
        auVar24._12_4_ = (int)(uVar12 >> 0x20);
        lVar1 = lVar5 + lVar4 * 4;
        lVar13 = 0;
        auVar24 = auVar24 ^ _DAT_001a9230;
        do {
          auVar21._8_4_ = (int)lVar13;
          auVar21._0_8_ = lVar13;
          auVar21._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar25 = (auVar21 | auVar6) ^ auVar7;
          iVar19 = auVar24._4_4_;
          if ((bool)(~(auVar25._4_4_ == iVar19 && auVar24._0_4_ < auVar25._0_4_ ||
                      iVar19 < auVar25._4_4_) & 1)) {
            *(wchar_t *)(lVar1 + lVar13 * 4) = wVar2;
          }
          if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
              auVar25._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar1 + 4 + lVar13 * 4) = wVar2;
          }
          auVar21 = (auVar21 | auVar8) ^ auVar7;
          iVar26 = auVar21._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar21._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar1 + 8 + lVar13 * 4) = wVar2;
            *(wchar_t *)(lVar1 + 0xc + lVar13 * 4) = wVar2;
          }
          lVar13 = lVar13 + 4;
        } while ((uVar12 - ((uint)(uVar9 + 0x3fffffffffffffff) & 3)) + 4 != lVar13);
      }
      auVar8 = _DAT_001acfc0;
      auVar7 = _DAT_001a9230;
      auVar6 = _DAT_001a9220;
      __dest = __dest + uVar9;
      if (uVar11 != size) {
        uVar11 = (uVar11 * 4 + (uVar9 + size) * -4) - 4;
        auVar25._8_4_ = (int)uVar11;
        auVar25._0_8_ = uVar11;
        auVar25._12_4_ = (int)(uVar11 >> 0x20);
        auVar16._0_8_ = uVar11 >> 2;
        auVar16._8_8_ = auVar25._8_8_ >> 2;
        lVar5 = lVar5 + size * 4 + lVar4 * 4 + uVar9 * 4;
        uVar9 = 0;
        auVar16 = auVar16 ^ _DAT_001a9230;
        do {
          auVar22._8_4_ = (int)uVar9;
          auVar22._0_8_ = uVar9;
          auVar22._12_4_ = (int)(uVar9 >> 0x20);
          auVar24 = (auVar22 | auVar6) ^ auVar7;
          iVar19 = auVar16._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar16._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar5 + uVar9 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar16._12_4_ || auVar24._8_4_ <= auVar16._8_4_) &&
              auVar24._12_4_ <= auVar16._12_4_) {
            *(wchar_t *)(lVar5 + 4 + uVar9 * 4) = wVar2;
          }
          auVar24 = (auVar22 | auVar8) ^ auVar7;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar16._0_4_)) {
            *(wchar_t *)(lVar5 + 8 + uVar9 * 4) = wVar2;
            *(wchar_t *)(lVar5 + 0xc + uVar9 * 4) = wVar2;
          }
          uVar9 = uVar9 + 4;
        } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar11 - size != 0) {
        uVar9 = (uVar11 * 4 + size * -4) - 4;
        auVar14._8_4_ = (int)uVar9;
        auVar14._0_8_ = uVar9;
        auVar14._12_4_ = (int)(uVar9 >> 0x20);
        auVar15._0_8_ = uVar9 >> 2;
        auVar15._8_8_ = auVar14._8_8_ >> 2;
        lVar5 = lVar5 + lVar4 * 4;
        uVar12 = 0;
        auVar15 = auVar15 ^ _DAT_001a9230;
        do {
          auVar20._8_4_ = (int)uVar12;
          auVar20._0_8_ = uVar12;
          auVar20._12_4_ = (int)(uVar12 >> 0x20);
          auVar24 = (auVar20 | auVar6) ^ auVar7;
          iVar19 = auVar15._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar19 && auVar15._0_4_ < auVar24._0_4_ ||
                      iVar19 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar5 + uVar12 * 4) = wVar2;
          }
          if ((auVar24._12_4_ != auVar15._12_4_ || auVar24._8_4_ <= auVar15._8_4_) &&
              auVar24._12_4_ <= auVar15._12_4_) {
            *(wchar_t *)(lVar5 + 4 + uVar12 * 4) = wVar2;
          }
          auVar24 = (auVar20 | auVar8) ^ auVar7;
          iVar26 = auVar24._4_4_;
          if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar15._0_4_)) {
            *(wchar_t *)(lVar5 + 8 + uVar12 * 4) = wVar2;
            *(wchar_t *)(lVar5 + 0xc + uVar12 * 4) = wVar2;
          }
          uVar12 = uVar12 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      }
      __dest = __dest + (uVar11 - size);
    }
    else if (uVar11 != size) {
      uVar11 = (uVar11 * 4 + size * -4) - 4;
      auVar17._8_4_ = (int)uVar11;
      auVar17._0_8_ = uVar11;
      auVar17._12_4_ = (int)(uVar11 >> 0x20);
      auVar18._0_8_ = uVar11 >> 2;
      auVar18._8_8_ = auVar17._8_8_ >> 2;
      lVar5 = lVar5 + size * 4 + lVar4 * 4;
      uVar9 = 0;
      auVar18 = auVar18 ^ _DAT_001a9230;
      do {
        auVar23._8_4_ = (int)uVar9;
        auVar23._0_8_ = uVar9;
        auVar23._12_4_ = (int)(uVar9 >> 0x20);
        auVar24 = (auVar23 | auVar6) ^ auVar7;
        iVar19 = auVar18._4_4_;
        if ((bool)(~(auVar24._4_4_ == iVar19 && auVar18._0_4_ < auVar24._0_4_ ||
                    iVar19 < auVar24._4_4_) & 1)) {
          *(wchar_t *)(lVar5 + uVar9 * 4) = wVar2;
        }
        if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
            auVar24._12_4_ <= auVar18._12_4_) {
          *(wchar_t *)(lVar5 + 4 + uVar9 * 4) = wVar2;
        }
        auVar24 = (auVar23 | auVar8) ^ auVar7;
        iVar26 = auVar24._4_4_;
        if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar24._0_4_ <= auVar18._0_4_)) {
          *(wchar_t *)(lVar5 + 8 + uVar9 * 4) = wVar2;
          *(wchar_t *)(lVar5 + 0xc + uVar9 * 4) = wVar2;
        }
        uVar9 = uVar9 + 4;
      } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar9);
    }
  }
  else {
    uVar11 = lVar4 + size;
    puVar10 = puVar3;
    if ((ulong)puVar3[3] < uVar11) {
      (**(code **)*puVar3)(puVar3,uVar11);
      puVar10 = *(undefined8 **)(this + 8);
    }
    puVar3[2] = uVar11;
    __dest = (CharPtr)(lVar4 * 4 + puVar10[1]);
  }
  if (size != 0) {
    memmove(__dest,s,size << 2);
  }
  return __dest;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}